

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Value::operator+(Value *this,Value *rhs)

{
  bool bVar1;
  long lVar2;
  iterator this_00;
  string *in_RSI;
  Value *in_RDI;
  Value *item_1;
  iterator __end5_1;
  iterator __begin5_1;
  element_type *__range5_1;
  Value *item;
  iterator __end5;
  iterator __begin5;
  element_type *__range5;
  Value *res;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffec8;
  Value *in_stack_fffffffffffffed0;
  Value *this_01;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffee0;
  Value *in_stack_ffffffffffffff00;
  Value *in_stack_ffffffffffffff08;
  __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
  in_stack_ffffffffffffff18;
  Value *in_stack_ffffffffffffff20;
  reference in_stack_ffffffffffffff28;
  __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
  local_c8;
  element_type *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 local_91;
  long local_90;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  bVar1 = is_string((Value *)0x30dfbe);
  if ((bVar1) || (bVar1 = is_string((Value *)0x30dfcf), bVar1)) {
    to_str_abi_cxx11_(in_stack_ffffffffffffff08);
    to_str_abi_cxx11_(in_stack_ffffffffffffff08);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff00);
    Value(in_stack_ffffffffffffff00,in_RSI);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
  }
  else {
    bVar1 = is_number_integer((Value *)0x30e0d6);
    if ((bVar1) && (bVar1 = is_number_integer((Value *)0x30e0e9), bVar1)) {
      lVar2 = get<long>(in_stack_ffffffffffffff20);
      local_90 = get<long>(in_stack_ffffffffffffff20);
      local_90 = lVar2 + local_90;
      Value(in_stack_fffffffffffffed0,(int64_t *)in_stack_fffffffffffffec8);
    }
    else {
      bVar1 = is_array((Value *)0x30e13f);
      if ((bVar1) && (bVar1 = is_array((Value *)0x30e155), bVar1)) {
        local_91 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_a8 = 0;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                  ((vector<minja::Value,_std::allocator<minja::Value>_> *)0x30e18f);
        array((vector<minja::Value,_std::allocator<minja::Value>_> *)
              in_stack_ffffffffffffff18._M_current);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_stack_fffffffffffffee0)
        ;
        local_c0 = std::
                   __shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)in_stack_fffffffffffffed0);
        local_c8._M_current =
             (Value *)std::vector<minja::Value,_std::allocator<minja::Value>_>::begin
                                (in_stack_fffffffffffffec8);
        this_00 = std::vector<minja::Value,_std::allocator<minja::Value>_>::end
                            (in_stack_fffffffffffffec8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                   *)in_stack_fffffffffffffed0,
                                  (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                   *)in_stack_fffffffffffffec8), bVar1) {
          in_stack_ffffffffffffff28 =
               __gnu_cxx::
               __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
               ::operator*(&local_c8);
          push_back(this_00._M_current,in_stack_ffffffffffffff28);
          __gnu_cxx::
          __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
          ::operator++(&local_c8);
        }
        std::
        __shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffed0);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::begin(in_stack_fffffffffffffec8);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::end(in_stack_fffffffffffffec8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                   *)in_stack_fffffffffffffed0,
                                  (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                   *)in_stack_fffffffffffffec8), bVar1) {
          __gnu_cxx::
          __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
          ::operator*((__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                       *)&stack0xffffffffffffff18);
          push_back(this_00._M_current,in_stack_ffffffffffffff28);
          __gnu_cxx::
          __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
          ::operator++((__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                        *)&stack0xffffffffffffff18);
        }
      }
      else {
        this_01 = (Value *)get<double>(in_stack_ffffffffffffff20);
        get<double>(in_stack_ffffffffffffff20);
        Value(this_01,(double *)in_stack_fffffffffffffec8);
      }
    }
  }
  return in_RDI;
}

Assistant:

Value operator+(const Value& rhs) const {
      if (is_string() || rhs.is_string()) {
        return to_str() + rhs.to_str();
      } else if (is_number_integer() && rhs.is_number_integer()) {
        return get<int64_t>() + rhs.get<int64_t>();
      } else if (is_array() && rhs.is_array()) {
        auto res = Value::array();
        for (const auto& item : *array_) res.push_back(item);
        for (const auto& item : *rhs.array_) res.push_back(item);
        return res;
      } else {
        return get<double>() + rhs.get<double>();
      }
  }